

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_textedit_delete(nk_text_edit *state,int where,int len)

{
  int len_local;
  int where_local;
  nk_text_edit *state_local;
  
  nk_textedit_makeundo_delete(state,where,len);
  nk_str_delete_runes(&state->string,where,len);
  state->has_preferred_x = '\0';
  return;
}

Assistant:

NK_API void
nk_textedit_delete(struct nk_text_edit *state, int where, int len)
{
    /* delete characters while updating undo */
    nk_textedit_makeundo_delete(state, where, len);
    nk_str_delete_runes(&state->string, where, len);
    state->has_preferred_x = 0;
}